

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  element_type *peVar1;
  long lVar2;
  minstd_rand *rng;
  Model *model_00;
  element_type *this_00;
  int64_t iVar3;
  vector<int,_std::allocator<int>_> *line_00;
  __int_type _Var4;
  int in_ESI;
  FastText *in_RDI;
  float fVar5;
  float fVar6;
  int32_t id;
  real lr;
  real progress;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  Model model;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffb38;
  real in_stack_fffffffffffffb3c;
  Model *in_stack_fffffffffffffb40;
  int32_t in_stack_fffffffffffffb48;
  int32_t in_stack_fffffffffffffb4c;
  int32_t in_stack_fffffffffffffb50;
  float in_stack_fffffffffffffb54;
  Model *model_01;
  FastText *this_01;
  vector<int,_std::allocator<int>_> *line_01;
  undefined1 *puVar7;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  Dictionary *in_stack_fffffffffffffbc0;
  istream *in_stack_fffffffffffffbc8;
  Dictionary *in_stack_fffffffffffffbd0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbd8;
  real in_stack_fffffffffffffbe4;
  Model *in_stack_fffffffffffffbe8;
  Model *__i;
  undefined8 in_stack_fffffffffffffbf8;
  int32_t seed;
  int64_t iVar8;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffc00;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffc08;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffc10;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffc18;
  Model *in_stack_fffffffffffffc20;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [392];
  undefined1 local_218 [524];
  int local_c;
  
  seed = (int32_t)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_c = in_ESI;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x165dd8);
  std::ifstream::ifstream(local_218,(string *)peVar1,_S_in);
  lVar2 = (long)local_c;
  rng = (minstd_rand *)utils::size((ifstream *)in_stack_fffffffffffffb40);
  model_00 = (Model *)(lVar2 * (long)rng);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x165e2d);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
              CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  model_01 = (Model *)local_3a0;
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            (&in_stack_fffffffffffffb40->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  this_01 = (FastText *)(local_3c0 + 0x10);
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            (&in_stack_fffffffffffffb40->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  line_01 = (vector<int,_std::allocator<int>_> *)local_3c0;
  std::shared_ptr<fasttext::Matrix>::shared_ptr
            (&in_stack_fffffffffffffb40->wi_,
             (shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  puVar7 = local_3d0;
  std::shared_ptr<fasttext::Args>::shared_ptr
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffb40,
             (shared_ptr<fasttext::Args> *)
             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  Model::Model(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,seed);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x165eee);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x165efb);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x165f08);
  std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x165f15);
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x165f1f);
  if (peVar1->model == sup) {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x165f3a);
    Dictionary::getCounts((Dictionary *)model_00,(entry_type)((ulong)puVar7 >> 0x38));
    Model::setTargetCounts
              (in_stack_fffffffffffffb40,
               (vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  }
  else {
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16602d);
    Dictionary::getCounts((Dictionary *)model_00,(entry_type)((ulong)puVar7 >> 0x38));
    Model::setTargetCounts
              (in_stack_fffffffffffffb40,
               (vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  }
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16609b);
  iVar3 = Dictionary::ntokens(this_00);
  __i = (Model *)0x0;
  iVar8 = iVar3;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1660d0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1660dd);
  while( true ) {
    line_00 = (vector<int,_std::allocator<int>_> *)
              std::__atomic_base::operator_cast_to_long
                        ((__atomic_base<long> *)
                         CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1660fd);
    if (peVar1->epoch * iVar8 <= (long)line_00) break;
    _Var4 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    in_stack_fffffffffffffb54 = (float)_Var4;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x166141);
    fVar5 = in_stack_fffffffffffffb54 / (float)(peVar1->epoch * iVar8);
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x166170);
    fVar6 = (float)(peVar1->lr * (1.0 - (double)fVar5));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1661a9);
    if (peVar1->model == sup) {
      in_stack_fffffffffffffbb4 = -1;
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1661cc);
      in_stack_fffffffffffffb50 =
           Dictionary::getLine(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
                               (vector<int,_std::allocator<int>_> *)CONCAT44(fVar5,fVar6),
                               (int32_t *)
                               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
      in_stack_fffffffffffffb40 =
           (Model *)((long)&(((shared_ptr<fasttext::Args> *)&__i->wi_)->
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                    (long)in_stack_fffffffffffffb50);
      if (in_stack_fffffffffffffbb4 != -1) {
        supervised(this_01,model_01,(real)((ulong)iVar3 >> 0x20),line_00,
                   (vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                   in_stack_fffffffffffffb4c);
      }
    }
    else {
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16628a);
      if (peVar1->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1662a1);
        in_stack_fffffffffffffb4c =
             Dictionary::getLine(in_stack_fffffffffffffbc0,(istream *)CONCAT44(fVar5,fVar6),
                                 (vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),rng);
        in_stack_fffffffffffffb40 =
             (Model *)((long)&(((shared_ptr<fasttext::Args> *)&__i->wi_)->
                              super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      + (long)in_stack_fffffffffffffb4c);
        cbow((FastText *)in_stack_fffffffffffffb40,in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
      }
      else {
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x166315);
        in_stack_fffffffffffffb40 = __i;
        if (peVar1->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16632c);
          in_stack_fffffffffffffb48 =
               Dictionary::getLine(in_stack_fffffffffffffbc0,(istream *)CONCAT44(fVar5,fVar6),
                                   (vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),rng
                                  );
          in_stack_fffffffffffffb40 =
               (Model *)((long)&(((shared_ptr<fasttext::Args> *)&__i->wi_)->
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr + (long)in_stack_fffffffffffffb48);
          skipgram(in_RDI,model_00,(real)((ulong)puVar7 >> 0x20),line_01);
        }
      }
    }
    __i = in_stack_fffffffffffffb40;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1663ae);
    if ((long)peVar1->lrUpdateRate < (long)in_stack_fffffffffffffb40) {
      std::__atomic_base<long>::operator+=
                (&(in_RDI->tokenCount_).super___atomic_base<long>,(__int_type)__i);
      __i = (Model *)0x0;
      if ((local_c == 0) &&
         (peVar1 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1663f8), 1 < peVar1->verbose)) {
        in_stack_fffffffffffffb3c = Model::getLoss((Model *)(local_3a0 + 0x10));
        std::atomic<float>::operator=
                  ((atomic<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
      }
    }
  }
  if (local_c == 0) {
    Model::getLoss((Model *)(local_3a0 + 0x10));
    std::atomic<float>::operator=
              ((atomic<float> *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
  Model::~Model(in_stack_fffffffffffffb40);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
	std::ifstream ifs(args_->input);
	utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

	Model model(input_, output_, weights_, args_, 0);
	if (args_->model == model_name::sup) {
		model.setTargetCounts(dict_->getCounts(entry_type::label));
	} else {
		model.setTargetCounts(dict_->getCounts(entry_type::word));
	}

	const int64_t ntokens = dict_->ntokens();
	int64_t localTokenCount = 0;
	std::vector<int32_t> line, labels;
	while (tokenCount_ < args_->epoch * ntokens) {
		real progress = real(tokenCount_) / (args_->epoch * ntokens);
		real lr = args_->lr * (1.0 - progress);
		if (args_->model == model_name::sup) {
			int32_t id = -1;
			localTokenCount += dict_->getLine(ifs, line, labels,id);
			if(id!=-1)
				supervised(model, lr, line, labels, id);
		} else if (args_->model == model_name::cbow) {
			localTokenCount += dict_->getLine(ifs, line, model.rng);
			cbow(model, lr, line);
		} else if (args_->model == model_name::sg) {
			localTokenCount += dict_->getLine(ifs, line, model.rng);
			skipgram(model, lr, line);
		}
		if (localTokenCount > args_->lrUpdateRate) {
			tokenCount_ += localTokenCount;
			localTokenCount = 0;
			if (threadId == 0 && args_->verbose > 1)
				loss_ = model.getLoss();
		}
	}
	if (threadId == 0)
		loss_ = model.getLoss();
	ifs.close();
}